

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

void CNetBan::ConUnban(IResult *pResult,void *pUser)

{
  int iVar1;
  char *pcVar2;
  IConsole *pIVar3;
  CNetBan *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  char *pSeparator;
  CNetBan *pThis;
  CNetRange Range;
  NETADDR_conflict Addr;
  char aBuf [256];
  NETADDR_conflict *in_stack_fffffffffffffe78;
  CNetBan *in_stack_fffffffffffffe80;
  CNetBan *this;
  CNetBan *this_00;
  CBan<NETADDR> *local_8;
  
  local_8 = *(CBan<NETADDR> **)(in_FS_OFFSET + 0x28);
  this = (CNetBan *)&stack0xfffffffffffffef8;
  this_00 = in_RSI;
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  str_copy((char *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,0);
  pcVar2 = str_find(&stack0xfffffffffffffef8,"-");
  iVar1 = str_is_number(&stack0xfffffffffffffef8);
  if (iVar1 == 0) {
    str_toint((char *)0x15127e);
    UnbanByIndex(this_00,(int)((ulong)in_RSI >> 0x20));
  }
  else if ((pcVar2 == (char *)0x0) || (pcVar2[1] == '\0')) {
    iVar1 = net_addr_from_str((NETADDR *)this,(char *)in_stack_fffffffffffffe80);
    if (iVar1 == 0) {
      UnbanByAddr(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    else {
      pIVar3 = Console(in_RSI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                (pIVar3,0,"net_ban","unban error (invalid network address)");
    }
  }
  else {
    *pcVar2 = '\0';
    iVar1 = net_addr_from_str((NETADDR *)this,(char *)in_stack_fffffffffffffe80);
    if ((iVar1 == 0) &&
       (iVar1 = net_addr_from_str((NETADDR *)this,(char *)in_stack_fffffffffffffe80), iVar1 == 0)) {
      UnbanByRange(this,(CNetRange *)in_stack_fffffffffffffe80);
    }
    else {
      pIVar3 = Console(in_RSI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                (pIVar3,0,"net_ban","unban error (invalid range)");
    }
  }
  if (*(CBan<NETADDR> **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNetBan::ConUnban(IConsole::IResult *pResult, void *pUser)
{
	CNetBan *pThis = static_cast<CNetBan *>(pUser);

	char aBuf[256];
	str_copy(aBuf, pResult->GetString(0), sizeof(aBuf));
	const char *pSeparator = str_find(aBuf, "-");

	if(!str_is_number(aBuf))
	{
		pThis->UnbanByIndex(str_toint(aBuf));
	}
	else if(pSeparator == NULL || pSeparator[1] == '\0')
	{
		NETADDR Addr;
		if(net_addr_from_str(&Addr, aBuf) == 0)
			pThis->UnbanByAddr(&Addr);
		else
			pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban error (invalid network address)");
	}
	else
	{
		aBuf[pSeparator-&aBuf[0]] = '\0';

		CNetRange Range;
		if(net_addr_from_str(&Range.m_LB, aBuf) == 0 && net_addr_from_str(&Range.m_UB, pSeparator+1) == 0)
			pThis->UnbanByRange(&Range);
		else
			pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban error (invalid range)");
	}
}